

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

bool __thiscall
jrtplib::RTPSources::CheckCollision
          (RTPSources *this,RTPInternalSourceData *srcdat,RTPAddress *senderaddress,bool isrtp)

{
  RTPAddress *pRVar1;
  int iVar2;
  RTPAddress **ppRVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,isrtp) == 0) {
    if ((srcdat->super_RTPSourceData).isrtcpaddrset == false) {
      if ((srcdat->super_RTPSourceData).isrtpaddrset != true) goto LAB_00124e2f;
      ppRVar3 = &(srcdat->super_RTPSourceData).rtpaddr;
      goto LAB_00124e01;
    }
    ppRVar3 = &(srcdat->super_RTPSourceData).rtcpaddr;
  }
  else {
    if ((srcdat->super_RTPSourceData).isrtpaddrset == false) {
      if ((srcdat->super_RTPSourceData).isrtcpaddrset == false) goto LAB_00124e1b;
      ppRVar3 = &(srcdat->super_RTPSourceData).rtcpaddr;
LAB_00124e01:
      pRVar1 = *ppRVar3;
      if (pRVar1 == (RTPAddress *)0x0) {
        if (senderaddress == (RTPAddress *)0x0) {
          if (!isrtp) {
            RTPInternalSourceData::SetRTCPDataAddress(srcdat,(RTPAddress *)0x0);
            return false;
          }
          RTPInternalSourceData::SetRTPDataAddress(srcdat,(RTPAddress *)0x0);
          return false;
        }
      }
      else {
        iVar2 = (*pRVar1->_vptr_RTPAddress[2])(pRVar1,senderaddress);
        if ((char)iVar2 != '\0') {
          if (!isrtp) {
LAB_00124e2f:
            RTPInternalSourceData::SetRTCPDataAddress(srcdat,senderaddress);
            return false;
          }
LAB_00124e1b:
          RTPInternalSourceData::SetRTPDataAddress(srcdat,senderaddress);
          return false;
        }
      }
      goto LAB_00124e44;
    }
    ppRVar3 = &(srcdat->super_RTPSourceData).rtpaddr;
  }
  pRVar1 = *ppRVar3;
  if (pRVar1 == (RTPAddress *)0x0) {
    if (senderaddress == (RTPAddress *)0x0) {
      return false;
    }
  }
  else {
    iVar2 = (*pRVar1->_vptr_RTPAddress[1])(pRVar1,senderaddress);
    if ((char)iVar2 != '\0') {
      return false;
    }
  }
LAB_00124e44:
  (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[4])(this,srcdat,senderaddress,isrtp);
  return true;
}

Assistant:

bool RTPSources::CheckCollision(RTPInternalSourceData *srcdat,const RTPAddress *senderaddress,bool isrtp)
{
	bool isset,otherisset;
	const RTPAddress *addr,*otheraddr;
	
	if (isrtp)
	{
		isset = srcdat->IsRTPAddressSet();
		addr = srcdat->GetRTPDataAddress();
		otherisset = srcdat->IsRTCPAddressSet();
		otheraddr = srcdat->GetRTCPDataAddress();
	}
	else
	{
		isset = srcdat->IsRTCPAddressSet();
		addr = srcdat->GetRTCPDataAddress();
		otherisset = srcdat->IsRTPAddressSet();
		otheraddr = srcdat->GetRTPDataAddress();
	}

	if (!isset)
	{
		if (otherisset) // got other address, can check if it comes from same host
		{
			if (otheraddr == 0) // other came from our own session
			{
				if (senderaddress != 0)
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, store it

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
			else
			{
				if (!otheraddr->IsFromSameHost(senderaddress))
				{
					OnSSRCCollision(srcdat,senderaddress,isrtp);
					return true;
				}

				// Ok, comes from same host, store the address

				if (isrtp)
					srcdat->SetRTPDataAddress(senderaddress);
				else
					srcdat->SetRTCPDataAddress(senderaddress);
			}
		}
		else // no other address, store this one
		{
			if (isrtp)
				srcdat->SetRTPDataAddress(senderaddress);
			else
				srcdat->SetRTCPDataAddress(senderaddress);
		}
	}
	else // already got an address
	{
		if (addr == 0)
		{
			if (senderaddress != 0)
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
		else
		{
			if (!addr->IsSameAddress(senderaddress))
			{
				OnSSRCCollision(srcdat,senderaddress,isrtp);
				return true;
			}
		}
	}
	
	return false;
}